

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormulaTransformer.cpp
# Opt level: O1

Formula * __thiscall Kernel::FormulaTransformer::applyNot(FormulaTransformer *this,Formula *f)

{
  Formula *pFVar1;
  void **head;
  
  pFVar1 = apply(this,*(Formula **)(f + 1));
  if (pFVar1 != *(Formula **)(f + 1)) {
    if (pFVar1->_connective == NOT) {
      f = *(Formula **)(pFVar1 + 1);
    }
    else {
      f = (Formula *)
          ::Lib::FixedSizeAllocator<48UL>::alloc
                    ((FixedSizeAllocator<48UL> *)(::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x60));
      f->_connective = NOT;
      (f->_label)._M_dataplus._M_p = (pointer)&(f->_label).field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&f->_label,Formula::DEFAULT_LABEL_abi_cxx11_,
                 DAT_00b7c330 + Formula::DEFAULT_LABEL_abi_cxx11_);
      *(Formula **)(f + 1) = pFVar1;
    }
  }
  return f;
}

Assistant:

Formula* FormulaTransformer::applyNot(Formula* f)
{
  Formula* newArg = apply(f->uarg());
  if(newArg==f->uarg()) {
    return f;
  }
  if(newArg->connective()==NOT) {
    return newArg->uarg();
  }
  return new NegatedFormula(newArg);
}